

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWSLoader.h
# Opt level: O2

bool __thiscall Assimp::LWS::NodeDesc::operator==(NodeDesc *this,uint num)

{
  if (num != 0) {
    return (num & 0xfffffff) == this->number && num >> 0x1c == this->type;
  }
  return false;
}

Assistant:

bool operator == (unsigned int num)  const {
        if (!num)
            return false;
        unsigned int _type = num >> 28u;

        return _type == static_cast<unsigned int>(type) && (num & AI_LWS_MASK) == number;
    }